

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTRawBufferCopyAction_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  JsRTRawBufferCopyAction *pJVar1;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferCopyAction,(TTD::NSLogEvents::EventKind)62>
                     (evt);
  (*writer->_vptr_FileWriter[3])(writer,0x12,1);
  NSSnapValues::EmitTTDVar(pJVar1->Dst,writer,NoSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x12,1);
  NSSnapValues::EmitTTDVar(pJVar1->Src,writer,NoSeparator);
  FileWriter::WriteUInt32(writer,u32Val,pJVar1->DstIndx,CommaSeparator);
  FileWriter::WriteUInt32(writer,u32Val,pJVar1->SrcIndx,CommaSeparator);
  FileWriter::WriteUInt32(writer,u32Val,pJVar1->Count,CommaSeparator);
  return;
}

Assistant:

void JsRTRawBufferCopyAction_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTRawBufferCopyAction* rbcAction = GetInlineEventDataAs<JsRTRawBufferCopyAction, EventKind::RawBufferCopySync>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(rbcAction->Dst, writer, NSTokens::Separator::NoSeparator);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(rbcAction->Src, writer, NSTokens::Separator::NoSeparator);

            writer->WriteUInt32(NSTokens::Key::u32Val, rbcAction->DstIndx, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, rbcAction->SrcIndx, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, rbcAction->Count, NSTokens::Separator::CommaSeparator);
        }